

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctocsv.cpp
# Opt level: O0

void doit(bool skipheader,bool fullprecision,bool show_exposure_value,
         bool remove_zero_exposure_records,bool ord_output,bool all_idx,bool parquet_output,
         string *parquetOutFile)

{
  int local_7c;
  duration<long,_std::ratio<1L,_1000L>_> local_78;
  int local_70;
  int local_6c;
  OASIS_FLOAT impacted_exp_1;
  OASIS_FLOAT impacted_exp;
  sampleslevelRec sr;
  summarySampleslevelHeader sh;
  int summary_set;
  int samplesize;
  int stream_type;
  size_t i;
  int summarycalcstream_type;
  string local_30 [33];
  byte local_f;
  byte local_e;
  byte local_d;
  undefined1 local_c;
  byte local_b;
  byte local_a;
  byte local_9;
  bool parquet_output_local;
  bool all_idx_local;
  bool ord_output_local;
  bool remove_zero_exposure_records_local;
  bool show_exposure_value_local;
  bool fullprecision_local;
  bool skipheader_local;
  
  local_f = parquet_output;
  local_e = all_idx;
  local_d = ord_output;
  local_c = remove_zero_exposure_records;
  local_b = show_exposure_value;
  local_a = fullprecision;
  local_9 = skipheader;
  if (remove_zero_exposure_records) {
    std::__cxx11::string::string(local_30,(string *)parquetOutFile);
    doitz(skipheader,fullprecision,show_exposure_value,ord_output,all_idx,parquet_output,
          (string *)local_30);
    std::__cxx11::string::~string(local_30);
  }
  else {
    i._0_4_ = 0;
    fread(&i,4,1,_stdin);
    if (((uint)i & 0x3000000) != 0x3000000) {
      std::operator<<((ostream *)&std::cerr,"FATAL: Not a summarycalc stream type\n");
      exit(-1);
    }
    if (((uint)i & 0xffffff) == 1) {
      if ((local_9 & 1) == 0) {
        if ((local_d & 1) == 1) {
          printf("EventId,SummaryId,SampleId,Loss,ImpactedExposure\n");
        }
        else if ((local_f & 1) == 0) {
          if ((local_b & 1) == 1) {
            printf("event_id,exposure_value,summary_id,sidx,loss\n");
          }
          else {
            printf("event_id,summary_id,sidx,loss\n");
          }
        }
      }
      sh.expval = 0.0;
      sh.summary_id = 0;
      _samplesize = fread(&sh.expval,4,1,_stdin);
      if (_samplesize != 0) {
        _samplesize = fread(&sh.summary_id,4,1,_stdin);
      }
      while (_samplesize != 0) {
        _samplesize = fread(&sr,0xc,1,_stdin);
        while (((_samplesize != 0 &&
                (_samplesize = fread(&impacted_exp_1,8,1,_stdin), _samplesize != 0)) &&
               (impacted_exp_1 != 0.0))) {
          if (((local_e & 1) != 0) || (impacted_exp_1 != -NAN)) {
            rowcount = rowcount + 1;
            if ((local_a & 1) == 1) {
              if ((local_d & 1) == 1) {
                local_6c = sh.event_id;
                if ((impacted_exp == 0.0) && (!NAN(impacted_exp))) {
                  local_6c = 0;
                }
                printf("%d,%d,%d,%f,%f\n",(double)impacted_exp,(ulong)(uint)sr.sidx,
                       (ulong)(uint)sr.loss,(ulong)(uint)impacted_exp_1);
              }
              else if ((local_f & 1) == 0) {
                if ((local_b & 1) == 1) {
                  printf("%d,%f,%d,%d,%f\n",(double)(float)sh.event_id,(ulong)(uint)sr.sidx,
                         (ulong)(uint)sr.loss,(ulong)(uint)impacted_exp_1);
                }
                else {
                  printf("%d,%d,%d,%f\n",(double)impacted_exp,(ulong)(uint)sr.sidx,
                         (ulong)(uint)sr.loss,(ulong)(uint)impacted_exp_1);
                }
              }
            }
            else if ((local_d & 1) == 1) {
              local_70 = sh.event_id;
              if ((impacted_exp == 0.0) && (!NAN(impacted_exp))) {
                local_70 = 0;
              }
              printf("%d,%d,%d,%.2f,%.2f\n",(double)impacted_exp,(ulong)(uint)sr.sidx,
                     (ulong)(uint)sr.loss,(ulong)(uint)impacted_exp_1);
            }
            else if ((local_f & 1) == 0) {
              if ((local_b & 1) == 1) {
                printf("%d,%.2f,%d,%d,%.2f\n",(double)(float)sh.event_id,(ulong)(uint)sr.sidx,
                       (ulong)(uint)sr.loss,(ulong)(uint)impacted_exp_1);
              }
              else {
                printf("%d,%d,%d,%.2f\n",(double)impacted_exp,(ulong)(uint)sr.sidx,
                       (ulong)(uint)sr.loss,(ulong)(uint)impacted_exp_1);
              }
            }
            if ((firstOutput & 1U) == 1) {
              local_7c = 1000;
              std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                        ((duration<long,std::ratio<1l,1000l>> *)&local_78,&local_7c);
              std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_78);
              firstOutput = false;
            }
          }
        }
      }
    }
    else {
      fprintf(_stderr,"FATAL: Unsupported summarycalc stream type\n");
    }
  }
  return;
}

Assistant:

void doit(bool skipheader, bool fullprecision,bool show_exposure_value,
	  bool remove_zero_exposure_records, bool ord_output, bool all_idx,
	  bool parquet_output, std::string parquetOutFile)
{
	if (remove_zero_exposure_records == true) {
		doitz(skipheader, fullprecision, show_exposure_value, ord_output, all_idx, parquet_output, parquetOutFile);
		return;
	}
	int summarycalcstream_type = 0;
	size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, stdin);
	int stream_type = summarycalcstream_type & summarycalc_id;

	if (stream_type != summarycalc_id) {
		std::cerr << "FATAL: Not a summarycalc stream type\n";
		exit(-1);
	}
	stream_type = streamno_mask & summarycalcstream_type;

	if (stream_type == 1 ){
		if (skipheader == false) {
			// ORD output flag takes priority over exposure value flag
			// ImpactedNumLocs not currently supported in ORD output
			if (ord_output == true) {
				printf("EventId,SummaryId,SampleId,Loss,ImpactedExposure\n");
			} else if (parquet_output == false) {
				if (show_exposure_value == true)
					printf("event_id,exposure_value,summary_id,sidx,loss\n");
				else printf("event_id,summary_id,sidx,loss\n");
			}
		}
#ifdef HAVE_PARQUET
		parquet::StreamWriter os;
		if (parquet_output == true)
			os = OasisParquet::GetParquetStreamWriter(OasisParquet::SELT,
								  parquetOutFile);
#endif
		int samplesize=0;
		int summary_set = 0;
		i=fread(&samplesize, sizeof(samplesize), 1, stdin);
		if( i != 0) i=fread(&summary_set, sizeof(samplesize), 1, stdin);
		while (i != 0){
			summarySampleslevelHeader sh;
			i = fread(&sh, sizeof(sh), 1, stdin);
			while (i != 0){
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, stdin);
				if (i == 0) break;	
				if (sr.sidx == 0) break;
				if (!all_idx && sr.sidx == max_loss_idx) {   // Only output MaxLoss if flag set
					continue;
				}
				rowcount++;
#ifdef HAVE_PARQUET
				if (parquet_output == true) {
					float impacted_exp = sh.expval;
					if (sr.loss == 0) impacted_exp = 0;
					os << sh.event_id << sh.summary_id
					   << sr.sidx << (float)sr.loss
					   << impacted_exp << parquet::EndRow;
				}
#endif
				if (fullprecision == true) {
					// ORD output flag takes priority over exposure value flag
					if (ord_output == true) {
						OASIS_FLOAT impacted_exp = sh.expval;
						if (sr.loss == 0) impacted_exp = 0;
						printf("%d,%d,%d,%f,%f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss, impacted_exp);
					} else if (parquet_output == false) {
						if (show_exposure_value == true) {
							printf("%d,%f,%d,%d,%f\n", sh.event_id, sh.expval, sh.summary_id, sr.sidx, sr.loss);
						} else {
							printf("%d,%d,%d,%f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss);
						}
					}
				} else {
					// ORD output flag takes priority over exposure value flag
					if (ord_output == true) {
						OASIS_FLOAT impacted_exp = sh.expval;
						if (sr.loss == 0) impacted_exp = 0;
						printf("%d,%d,%d,%.2f,%.2f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss, impacted_exp);
					} else if (parquet_output == false) {
						if (show_exposure_value == true) {
							printf("%d,%.2f,%d,%d,%.2f\n", sh.event_id, sh.expval, sh.summary_id, sr.sidx, sr.loss);
						} else {
							printf("%d,%d,%d,%.2f\n", sh.event_id, sh.summary_id, sr.sidx, sr.loss);
						}
					}
				}
				if (firstOutput==true){
					std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY));  // used to stop possible race condition with kat
					firstOutput=false;
				} 				
			}
		}
		return;
	}
	fprintf(stderr,"FATAL: Unsupported summarycalc stream type\n");

}